

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O0

bool __thiscall sglr::pdec::ShaderProgramDeclaration::valid(ShaderProgramDeclaration *this)

{
  bool bVar1;
  ShaderProgramDeclaration *this_local;
  
  if (((this->m_vertexShaderSet & 1U) == 0) || ((this->m_fragmentShaderSet & 1U) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::vector<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>::
            empty(&this->m_fragmentOutputs);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = hasGeometryShader(this);
      if (bVar1) {
        if (((this->m_geometryDecl).inputType == GEOMETRYSHADERINPUTTYPE_LAST) ||
           ((this->m_geometryDecl).outputType == GEOMETRYSHADEROUTPUTTYPE_LAST)) {
          return false;
        }
      }
      else if (((((this->m_geometryDecl).inputType != GEOMETRYSHADERINPUTTYPE_LAST) ||
                ((this->m_geometryDecl).outputType != GEOMETRYSHADEROUTPUTTYPE_LAST)) ||
               ((this->m_geometryDecl).numOutputVertices != 0)) ||
              ((this->m_geometryDecl).numInvocations != 0)) {
        return false;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ShaderProgramDeclaration::valid (void) const
{
	if (!m_vertexShaderSet || !m_fragmentShaderSet)
		return false;

	if (m_fragmentOutputs.empty())
		return false;

	if (hasGeometryShader())
	{
		if (m_geometryDecl.inputType == rr::GEOMETRYSHADERINPUTTYPE_LAST ||
			m_geometryDecl.outputType == rr::GEOMETRYSHADEROUTPUTTYPE_LAST)
			return false;
	}
	else
	{
		if (m_geometryDecl.inputType != rr::GEOMETRYSHADERINPUTTYPE_LAST ||
			m_geometryDecl.outputType != rr::GEOMETRYSHADEROUTPUTTYPE_LAST ||
			m_geometryDecl.numOutputVertices != 0 ||
			m_geometryDecl.numInvocations != 0)
			return false;
	}

	return true;
}